

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O2

void __thiscall interfaces_tests::findBlock::test_method(findBlock *this)

{
  long lVar1;
  Chain *pCVar2;
  int iVar3;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar4;
  Chainstate *pCVar5;
  char *pcVar6;
  iterator pvVar7;
  iterator pvVar8;
  uint256 *puVar9;
  int *piVar10;
  int64_t *piVar11;
  uint256 *puVar12;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  check_type cVar15;
  int *piVar13;
  lazy_ostream *assertion_descr;
  assertion_result *paVar14;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  assertion_result local_4a8;
  char **local_490;
  char *local_488;
  element_type *local_480;
  shared_count sStack_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  bool next_active;
  bool cur_active;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  int64_t mtp_time;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  int64_t max_time;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  int64_t time;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  int height;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  undefined1 local_1a8 [8];
  element_type *peStack_1a0;
  shared_count sStack_198;
  undefined1 *puStack_190;
  undefined8 uStack_188;
  bool *local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined1 local_158 [8];
  element_type *local_150;
  shared_count sStack_148;
  assertion_result *local_140;
  uint256 next_hash;
  undefined1 local_118 [16];
  undefined8 local_108;
  uint256 *puStack_100;
  int64_t *local_f8;
  bool *pbStack_f0;
  undefined8 local_e8;
  assertion_result *paStack_e0;
  CBlock *local_d8;
  undefined8 uStack_d0;
  CBlock data;
  uint256 hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node.chainman;
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            (puVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x14,"test_method","m_node.chainman");
  pvVar7 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock11,&cs_main,"Assert(m_node.chainman)->GetMutex()",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
             ,0x14,false);
  pcVar6 = "m_node.chainman";
  puVar4 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (puVar4,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
                      ,0x16,"test_method","m_node.chainman");
  pCVar5 = ChainstateManager::ActiveChainstate
                     ((puVar4->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x19;
  file.m_begin = (iterator)&local_1c8;
  msg.m_end = pvVar7;
  msg.m_begin = pcVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d8,msg);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  puVar12 = (uint256 *)local_118;
  CBlockIndex::GetBlockHash
            (puVar12,(pCVar5->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_start[10]);
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  data.super_CBlockHeader.nTime = 0;
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  data.super_CBlockHeader.nBits = 0;
  data.super_CBlockHeader.nNonce = 0;
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  data.super_CBlockHeader._0_8_ = &hash;
  iVar3 = (*pCVar2->_vptr_Chain[10])(pCVar2,puVar12);
  next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  puStack_190 = local_158;
  local_158 = (undefined1  [8])0xbaa47f;
  local_150 = (element_type *)0xbaa4c4;
  peStack_1a0 = (element_type *)((ulong)peStack_1a0 & 0xffffffffffffff00);
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_198.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_1e0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  next_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)iVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&next_hash,(lazy_ostream *)local_1a8,1,0,WARN,_cVar15,
             (size_t)&local_1e8,0x19);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = &DAT_0000001a;
  file_00.m_begin = (iterator)&local_1f8;
  msg_00.m_end = pvVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208,
             msg_00);
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ &
       0xffffffffffffff00;
  data.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_011480b0;
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_210 = "";
  CBlockIndex::GetBlockHash
            (puVar12,(pCVar5->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_start[10]);
  pvVar7 = (iterator)0x2;
  puVar9 = &hash;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&data,&local_218,0x1a,1,2,puVar9,"hash",puVar12,"active[10]->GetBlockHash()");
  height = -1;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x1d;
  file_01.m_begin = (iterator)&local_230;
  msg_01.m_end = (iterator)puVar9;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_240,
             msg_01);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash
            ((uint256 *)local_118,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[0x14]);
  data.super_CBlockHeader.nVersion = 0;
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  data.super_CBlockHeader.nTime = 0;
  data.super_CBlockHeader.nBits = 0;
  data.super_CBlockHeader.nNonce = 0;
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  data.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ = &height;
  iVar3 = (*pCVar2->_vptr_Chain[10])(pCVar2,(uint256 *)local_118);
  next_hash.super_base_blob<256U>.m_data._M_elems[0] = (uchar)iVar3;
  next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_158 = (undefined1  [8])0xbaa4e0;
  local_150 = (element_type *)0xbaa529;
  peStack_1a0 = (element_type *)((ulong)peStack_1a0 & 0xffffffffffffff00);
  local_1a8 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_198.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  puStack_190 = local_158;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_248 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&next_hash,(lazy_ostream *)local_1a8,1,0,WARN,(check_type)puVar12,
             (size_t)&local_250,0x1d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)(next_hash.super_base_blob<256U>.m_data._M_elems + 0x10));
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x1e;
  file_02.m_begin = (iterator)&local_260;
  msg_02.m_end = pvVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_270,
             msg_02);
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ =
       data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_8_ &
       0xffffffffffffff00;
  data.super_CBlockHeader._0_8_ = &PTR__lazy_ostream_011480b0;
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_8_ =
       boost::unit_test::lazy_ostream::inst;
  data.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_8_ =
       (long)"\x05\x04\x03\x02\x01" + 5;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_278 = "";
  piVar13 = &(pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[0x14]->nHeight;
  pvVar7 = (iterator)0x2;
  piVar10 = &height;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&data,&local_280,0x1e,1,2,piVar10,"height",piVar13,"active[20]->nHeight");
  CBlock::CBlock(&data);
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x21;
  file_03.m_begin = (iterator)&local_290;
  msg_03.m_end = (iterator)piVar10;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2a0,
             msg_03);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash
            ((uint256 *)local_1a8,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[0x1e]);
  uStack_d0 = 0;
  local_e8 = 0;
  paStack_e0 = (assertion_result *)0x0;
  local_f8 = (int64_t *)0x0;
  pbStack_f0 = (bool *)0x0;
  local_108._0_1_ = '\0';
  local_108._1_1_ = '\0';
  local_108._2_1_ = '\0';
  local_108._3_1_ = '\0';
  local_108._4_1_ = '\0';
  local_108._5_1_ = '\0';
  local_108._6_1_ = '\0';
  local_108._7_1_ = '\0';
  puStack_100 = (uint256 *)0x0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = 0;
  local_d8 = &data;
  iVar3 = (*pCVar2->_vptr_Chain[10])(pCVar2,(uint256 *)local_1a8);
  local_150 = (element_type *)0x0;
  sStack_148.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "chain->findBlock(active[30]->GetBlockHash(), FoundBlock().data(data))";
  local_4a8.m_message.px = (element_type *)0xbaa583;
  assertion_descr = (lazy_ostream *)&next_hash;
  next_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       next_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  next_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
  next_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_2a8 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  next_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_4a8;
  local_158[0] = (class_property<bool>)(bool)SUB41(iVar3,0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_158,assertion_descr,1,0,WARN,(check_type)piVar13,
             (size_t)&local_2b0,0x21);
  boost::detail::shared_count::~shared_count(&sStack_148);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = &DAT_00000022;
  file_04.m_begin = (iterator)&local_2c0;
  msg_04.m_end = pvVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2d0,
             msg_04);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011480b0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  puStack_100 = (uint256 *)0xc7f1cc;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_2d8 = "";
  CBlockHeader::GetHash((uint256 *)local_1a8,&data.super_CBlockHeader);
  CBlockIndex::GetBlockHash
            ((uint256 *)assertion_descr,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[0x1e]);
  pvVar8 = (iterator)0x2;
  pvVar7 = local_1a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (local_118,&local_2e0,0x22,1,2,pvVar7,"data.GetHash()",assertion_descr,
             "active[30]->GetBlockHash()");
  time = -1;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x25;
  file_05.m_begin = (iterator)&local_2f8;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_308,
             msg_05);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  puVar12 = (uint256 *)local_1a8;
  CBlockIndex::GetBlockHash
            (puVar12,(pCVar5->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_start[0x28]);
  puStack_100 = (uint256 *)0x0;
  local_d8 = (CBlock *)0x0;
  uStack_d0 = 0;
  local_e8 = 0;
  paStack_e0 = (assertion_result *)0x0;
  local_f8 = (int64_t *)0x0;
  pbStack_f0 = (bool *)0x0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = 0;
  local_108 = (undefined1 *)&time;
  iVar3 = (*pCVar2->_vptr_Chain[10])(pCVar2,puVar12);
  local_158[0] = SUB41(iVar3,0);
  local_150 = (element_type *)0x0;
  sStack_148.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "chain->findBlock(active[40]->GetBlockHash(), FoundBlock().time(time))";
  local_4a8.m_message.px = (element_type *)0xbaa5f3;
  next_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       next_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  next_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
  next_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_310 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  next_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_4a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,0,WARN,
             (check_type)assertion_descr,(size_t)&local_318,0x25);
  boost::detail::shared_count::~shared_count(&sStack_148);
  local_328 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x26;
  file_06.m_begin = (iterator)&local_328;
  msg_06.m_end = pvVar8;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_338,
             msg_06);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011480b0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  puStack_100 = (uint256 *)0xc7f1cc;
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_340 = "";
  local_1a8 = (undefined1  [8])
              (ulong)(pCVar5->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_start[0x28]->nTime;
  pvVar7 = (iterator)0x2;
  piVar11 = &time;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_118,&local_348,0x26,1,2,piVar11,"time",puVar12,"active[40]->GetBlockTime()");
  max_time = -1;
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x29;
  file_07.m_begin = (iterator)&local_360;
  msg_07.m_end = (iterator)piVar11;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_370,
             msg_07);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  puVar9 = (uint256 *)local_1a8;
  CBlockIndex::GetBlockHash
            (puVar9,(pCVar5->m_chain).vChain.
                    super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                    super__Vector_impl_data._M_start[0x32]);
  local_108._0_1_ = '\0';
  local_108._1_1_ = '\0';
  local_108._2_1_ = '\0';
  local_108._3_1_ = '\0';
  local_108._4_1_ = '\0';
  local_108._5_1_ = '\0';
  local_108._6_1_ = '\0';
  local_108._7_1_ = '\0';
  local_d8 = (CBlock *)0x0;
  uStack_d0 = 0;
  local_e8 = 0;
  paStack_e0 = (assertion_result *)0x0;
  local_f8 = (int64_t *)0x0;
  pbStack_f0 = (bool *)0x0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = 0;
  puStack_100 = (uint256 *)&max_time;
  iVar3 = (*pCVar2->_vptr_Chain[10])(pCVar2,puVar9);
  local_158[0] = SUB41(iVar3,0);
  local_150 = (element_type *)0x0;
  sStack_148.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "chain->findBlock(active[50]->GetBlockHash(), FoundBlock().maxTime(max_time))";
  local_4a8.m_message.px = (element_type *)0xbaa65b;
  next_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       next_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  next_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
  next_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_378 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  next_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_4a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_158,(lazy_ostream *)&next_hash,1,0,WARN,(check_type)puVar12,
             (size_t)&local_380,0x29);
  boost::detail::shared_count::~shared_count(&sStack_148);
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2a;
  file_08.m_begin = (iterator)&local_390;
  msg_08.m_end = pvVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3a0,
             msg_08);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011480b0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  puStack_100 = (uint256 *)0xc7f1cc;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_3a8 = "";
  local_1a8 = (undefined1  [8])
              (ulong)(pCVar5->m_chain).vChain.
                     super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                     super__Vector_impl_data._M_start[0x32]->nTimeMax;
  pvVar7 = (iterator)0x2;
  piVar11 = &max_time;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_118,&local_3b0,0x2a,1,2,piVar11,"max_time",puVar9,"active[50]->GetBlockTimeMax()"
            );
  mtp_time = -1;
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2d;
  file_09.m_begin = (iterator)&local_3c8;
  msg_09.m_end = (iterator)piVar11;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3d8,
             msg_09);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash
            ((uint256 *)local_1a8,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[0x3c]);
  pbStack_f0 = (bool *)0x0;
  local_d8 = (CBlock *)0x0;
  uStack_d0 = 0;
  local_e8 = 0;
  paStack_e0 = (assertion_result *)0x0;
  local_108._0_1_ = '\0';
  local_108._1_1_ = '\0';
  local_108._2_1_ = '\0';
  local_108._3_1_ = '\0';
  local_108._4_1_ = '\0';
  local_108._5_1_ = '\0';
  local_108._6_1_ = '\0';
  local_108._7_1_ = '\0';
  puStack_100 = (uint256 *)0x0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = 0;
  local_f8 = &mtp_time;
  iVar3 = (*pCVar2->_vptr_Chain[10])(pCVar2,(uint256 *)local_1a8);
  paVar14 = (assertion_result *)local_158;
  local_158[0] = (class_property<bool>)SUB41(iVar3,0);
  local_150 = (element_type *)0x0;
  sStack_148.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "chain->findBlock(active[60]->GetBlockHash(), FoundBlock().mtpTime(mtp_time))";
  local_4a8.m_message.px = (element_type *)0xbaa6cf;
  next_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       next_hash.super_base_blob<256U>.m_data._M_elems._8_8_ & 0xffffffffffffff00;
  next_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = &PTR__lazy_ostream_011481f0;
  next_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_3e0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  next_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &local_4a8;
  boost::test_tools::tt_detail::report_assertion
            (paVar14,(lazy_ostream *)&next_hash,1,0,WARN,(check_type)puVar9,(size_t)&local_3e8,0x2d)
  ;
  boost::detail::shared_count::~shared_count(&sStack_148);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2e;
  file_10.m_begin = (iterator)&local_3f8;
  msg_10.m_end = pvVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_408,
             msg_10);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011480b0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  puStack_100 = (uint256 *)0xc7f1cc;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_410 = "";
  local_1a8 = (undefined1  [8])
              CBlockIndex::GetMedianTimePast
                        ((pCVar5->m_chain).vChain.
                         super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                         super__Vector_impl_data._M_start[0x3c]);
  pvVar7 = (iterator)0x2;
  piVar11 = &mtp_time;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
            (local_118,&local_418,0x2e,1,2,piVar11,"mtp_time",(uint256 *)local_1a8,
             "active[60]->GetMedianTimePast()");
  cur_active = false;
  next_active = false;
  next_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  next_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = &DAT_00000032;
  file_11.m_begin = (iterator)&local_430;
  msg_11.m_end = (iterator)piVar11;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_440,
             msg_11);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011480b0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  puStack_100 = (uint256 *)0xc7f1cc;
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_448 = "";
  local_1a8._0_4_ =
       (int)((ulong)((long)(pCVar5->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar5->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  local_158._0_4_ = 100;
  pvVar7 = (iterator)0x2;
  pvVar8 = local_1a8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (local_118,&local_450,0x32,1,2,local_1a8,"active.Height()",paVar14,"100");
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x33;
  file_12.m_begin = (iterator)&local_460;
  msg_12.m_end = pvVar8;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_470,
             msg_12);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash
            ((uint256 *)local_158,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[99]);
  local_f8 = (int64_t *)0x0;
  local_d8 = (CBlock *)0x0;
  uStack_d0 = 0;
  local_e8 = 0;
  local_108._0_1_ = '\0';
  local_108._1_1_ = '\0';
  local_108._2_1_ = '\0';
  local_108._3_1_ = '\0';
  local_108._4_1_ = '\0';
  local_108._5_1_ = '\0';
  local_108._6_1_ = '\0';
  local_108._7_1_ = '\0';
  puStack_100 = (uint256 *)0x0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = 0;
  pbStack_f0 = &cur_active;
  uStack_178 = 0;
  local_170 = 0;
  uStack_168 = 0;
  puStack_190 = (undefined1 *)0x0;
  uStack_188 = 0;
  peStack_1a0 = (element_type *)0x0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_160 = 0;
  local_180 = &next_active;
  local_1a8 = (undefined1  [8])&next_hash;
  paStack_e0 = (assertion_result *)local_1a8;
  iVar3 = (*pCVar2->_vptr_Chain[10])(pCVar2,(uint256 *)local_158);
  local_480 = (element_type *)0x0;
  sStack_478.pi_ = (sp_counted_base *)0x0;
  local_490 = &local_4b8;
  local_4b8 = 
  "chain->findBlock(active[99]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active).hash(next_hash)))"
  ;
  local_4b0 = "";
  local_4a8.m_message.px = (element_type *)((ulong)local_4a8.m_message.px & 0xffffffffffffff00);
  local_4a8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_4a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_4c0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  local_488._0_1_ = (class_property<bool>)(bool)SUB41(iVar3,0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_488,(lazy_ostream *)&local_4a8,1,0,WARN,(check_type)paVar14,
             (size_t)&local_4c8,0x33);
  boost::detail::shared_count::~shared_count(&sStack_478);
  local_4d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x34;
  file_13.m_begin = (iterator)&local_4d8;
  msg_13.m_end = pvVar8;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4e8,
             msg_13);
  local_1a8[0] = (class_property<bool>)(class_property<bool>)cur_active;
  peStack_1a0 = (element_type *)0x0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_158 = (undefined1  [8])0xbaa7a1;
  local_150 = (element_type *)0xbaa7ab;
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_4f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_4f0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  puStack_100 = (uint256 *)local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_118,1,0,WARN,(check_type)paVar14,
             (size_t)&local_4f8,0x34);
  boost::detail::shared_count::~shared_count(&sStack_198);
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x35;
  file_14.m_begin = (iterator)&local_508;
  msg_14.m_end = pvVar8;
  msg_14.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_518,
             msg_14);
  local_1a8[0] = (class_property<bool>)(class_property<bool>)next_active;
  peStack_1a0 = (element_type *)0x0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_158 = (undefined1  [8])0xbaa85c;
  local_150 = (element_type *)0xbaa867;
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_520 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  puStack_100 = (uint256 *)local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_118,1,0,WARN,(check_type)paVar14,
             (size_t)&local_528,0x35);
  boost::detail::shared_count::~shared_count(&sStack_198);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x36;
  file_15.m_begin = (iterator)&local_538;
  msg_15.m_end = pvVar8;
  msg_15.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_548,
             msg_15);
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011480b0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  puStack_100 = (uint256 *)0xc7f1cc;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_550 = "";
  CBlockIndex::GetBlockHash
            ((uint256 *)local_1a8,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[100]);
  pvVar7 = (iterator)0x2;
  puVar12 = &next_hash;
  paVar14 = (assertion_result *)local_1a8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (local_118,&local_558,0x36,1,2,puVar12,"next_hash",(assertion_result *)local_1a8,
             "active[100]->GetBlockHash()");
  next_active = false;
  cur_active = false;
  local_568 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_560 = "";
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x38;
  file_16.m_begin = (iterator)&local_568;
  msg_16.m_end = (iterator)puVar12;
  msg_16.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_578,
             msg_16);
  pCVar2 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
           super_BasicTestingSetup.m_node.chain._M_t.
           super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
           super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
           super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  CBlockIndex::GetBlockHash
            ((uint256 *)local_158,
             (pCVar5->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[100]);
  local_f8 = (int64_t *)0x0;
  local_d8 = (CBlock *)0x0;
  uStack_d0 = 0;
  local_e8 = 0;
  local_108._0_1_ = '\0';
  local_108._1_1_ = '\0';
  local_108._2_1_ = '\0';
  local_108._3_1_ = '\0';
  local_108._4_1_ = '\0';
  local_108._5_1_ = '\0';
  local_108._6_1_ = '\0';
  local_108._7_1_ = '\0';
  puStack_100 = (uint256 *)0x0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = 0;
  pbStack_f0 = &cur_active;
  uStack_188 = 0;
  uStack_168 = 0;
  local_160 = 0;
  uStack_178 = 0;
  local_170 = 0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  puStack_190 = (undefined1 *)0x0;
  local_1a8 = (undefined1  [8])0x0;
  peStack_1a0 = (element_type *)0x0;
  local_180 = &next_active;
  paStack_e0 = (assertion_result *)local_1a8;
  iVar3 = (*pCVar2->_vptr_Chain[10])(pCVar2,(uint256 *)local_158);
  local_488 = (char *)CONCAT71(local_488._1_7_,(class_property<bool>)SUB41(iVar3,0));
  local_480 = (element_type *)0x0;
  sStack_478.pi_ = (sp_counted_base *)0x0;
  local_4b8 = 
  "chain->findBlock(active[100]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active)))"
  ;
  local_4b0 = "";
  local_4a8.m_message.px = (element_type *)((ulong)local_4a8.m_message.px & 0xffffffffffffff00);
  local_4a8._0_8_ = &PTR__lazy_ostream_011481f0;
  local_4a8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_490 = &local_4b8;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_580 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_488,(lazy_ostream *)&local_4a8,1,0,WARN,(check_type)paVar14,
             (size_t)&local_588,0x38);
  boost::detail::shared_count::~shared_count(&sStack_478);
  local_598 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x39;
  file_17.m_begin = (iterator)&local_598;
  msg_17.m_end = pvVar8;
  msg_17.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_5a8,
             msg_17);
  local_1a8[0] = (class_property<bool>)(class_property<bool>)cur_active;
  peStack_1a0 = (element_type *)0x0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_158 = (undefined1  [8])0xbaa7a1;
  local_150 = (element_type *)0xbaa7ab;
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_5b0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  puStack_100 = (uint256 *)local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_118,1,0,WARN,(check_type)paVar14,
             (size_t)&local_5b8,0x39);
  boost::detail::shared_count::~shared_count(&sStack_198);
  local_5c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_5c0 = "";
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x3a;
  file_18.m_begin = (iterator)&local_5c8;
  msg_18.m_end = pvVar8;
  msg_18.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_5d8,
             msg_18);
  local_1a8 = (undefined1  [8])(CONCAT71(local_1a8._1_7_,next_active) ^ 1);
  peStack_1a0 = (element_type *)0x0;
  sStack_198.pi_ = (sp_counted_base *)0x0;
  local_158 = (undefined1  [8])0xbaa85b;
  local_150 = (element_type *)0xbaa867;
  local_118._8_8_ = local_118._8_8_ & 0xffffffffffffff00;
  local_118._0_8_ = &PTR__lazy_ostream_011481f0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_5e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_5e0 = "";
  pvVar7 = &DAT_00000001;
  pvVar8 = (iterator)0x0;
  puStack_100 = (uint256 *)local_158;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1a8,(lazy_ostream *)local_118,1,0,WARN,(check_type)paVar14,
             (size_t)&local_5e8,0x3a);
  boost::detail::shared_count::~shared_count(&sStack_198);
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x3c;
  file_19.m_begin = (iterator)&local_5f8;
  msg_19.m_end = pvVar8;
  msg_19.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_608,
             msg_19);
  sStack_198.pi_ = (sp_counted_base *)0x0;
  puStack_190 = (undefined1 *)0x0;
  local_1a8 = (undefined1  [8])0x0;
  peStack_1a0 = (element_type *)0x0;
  local_d8 = (CBlock *)0x0;
  uStack_d0 = 0;
  local_e8 = 0;
  paStack_e0 = (assertion_result *)0x0;
  local_f8 = (int64_t *)0x0;
  pbStack_f0 = (bool *)0x0;
  local_108._0_1_ = '\0';
  local_108._1_1_ = '\0';
  local_108._2_1_ = '\0';
  local_108._3_1_ = '\0';
  local_108._4_1_ = '\0';
  local_108._5_1_ = '\0';
  local_108._6_1_ = '\0';
  local_108._7_1_ = '\0';
  puStack_100 = (uint256 *)0x0;
  local_118._0_8_ = (_func_int **)0x0;
  local_118._8_8_ = 0;
  iVar3 = (*((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chain._M_t.
             super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
             super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
             super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl)->_vptr_Chain[10])();
  local_4a8._0_8_ = CONCAT71(local_4a8._1_7_,(char)iVar3) ^ 1;
  local_4a8.m_message.px = (element_type *)0x0;
  local_4a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_488 = "!chain->findBlock({}, FoundBlock())";
  local_480 = (element_type *)0xbaa88b;
  local_150 = (element_type *)((ulong)local_150 & 0xffffffffffffff00);
  local_158 = (undefined1  [8])&PTR__lazy_ostream_011481f0;
  sStack_148.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_610 = "";
  local_140 = (assertion_result *)&local_488;
  boost::test_tools::tt_detail::report_assertion
            (&local_4a8,(lazy_ostream *)local_158,1,0,WARN,(check_type)paVar14,(size_t)&local_618,
             0x3c);
  boost::detail::shared_count::~shared_count(&local_4a8.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&data.vtx);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock11.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findBlock)
{
    LOCK(Assert(m_node.chainman)->GetMutex());
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();

    uint256 hash;
    BOOST_CHECK(chain->findBlock(active[10]->GetBlockHash(), FoundBlock().hash(hash)));
    BOOST_CHECK_EQUAL(hash, active[10]->GetBlockHash());

    int height = -1;
    BOOST_CHECK(chain->findBlock(active[20]->GetBlockHash(), FoundBlock().height(height)));
    BOOST_CHECK_EQUAL(height, active[20]->nHeight);

    CBlock data;
    BOOST_CHECK(chain->findBlock(active[30]->GetBlockHash(), FoundBlock().data(data)));
    BOOST_CHECK_EQUAL(data.GetHash(), active[30]->GetBlockHash());

    int64_t time = -1;
    BOOST_CHECK(chain->findBlock(active[40]->GetBlockHash(), FoundBlock().time(time)));
    BOOST_CHECK_EQUAL(time, active[40]->GetBlockTime());

    int64_t max_time = -1;
    BOOST_CHECK(chain->findBlock(active[50]->GetBlockHash(), FoundBlock().maxTime(max_time)));
    BOOST_CHECK_EQUAL(max_time, active[50]->GetBlockTimeMax());

    int64_t mtp_time = -1;
    BOOST_CHECK(chain->findBlock(active[60]->GetBlockHash(), FoundBlock().mtpTime(mtp_time)));
    BOOST_CHECK_EQUAL(mtp_time, active[60]->GetMedianTimePast());

    bool cur_active{false}, next_active{false};
    uint256 next_hash;
    BOOST_CHECK_EQUAL(active.Height(), 100);
    BOOST_CHECK(chain->findBlock(active[99]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active).hash(next_hash))));
    BOOST_CHECK(cur_active);
    BOOST_CHECK(next_active);
    BOOST_CHECK_EQUAL(next_hash, active[100]->GetBlockHash());
    cur_active = next_active = false;
    BOOST_CHECK(chain->findBlock(active[100]->GetBlockHash(), FoundBlock().inActiveChain(cur_active).nextBlock(FoundBlock().inActiveChain(next_active))));
    BOOST_CHECK(cur_active);
    BOOST_CHECK(!next_active);

    BOOST_CHECK(!chain->findBlock({}, FoundBlock()));
}